

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O2

void __thiscall HTimer::~HTimer(HTimer *this)

{
  long lVar1;
  
  lVar1 = 0x4d0;
  do {
    std::__cxx11::string::~string((string *)((long)this->itemStart + lVar1 + -0x10));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != 400);
  return;
}

Assistant:

HTimer() {
        itemNames[HTICK_GROUP1] = "GP1";
        itemNames[HTICK_GROUP2] = "GP2";
        itemNames[HTICK_GROUP3] = "GP3";
        itemNames[HTICK_GROUP4] = "GP4";
        itemNames[HTICK_GROUP5] = "GP5";
        itemNames[HTICK_GROUP6] = "GP6";
        itemNames[HTICK_GROUP7] = "GP7";
        itemNames[HTICK_GROUP8] = "GP8";
        itemNames[HTICK_GROUP9] = "GP9";

        itemNames[HTICK_INVERT] = "INV";
        itemNames[HTICK_CHUZR1] = "CR1";
        itemNames[HTICK_CHUZC0] = "CC0";
        itemNames[HTICK_CHUZC1] = "CC1";
        itemNames[HTICK_CHUZC2] = "CC2";
        itemNames[HTICK_CHUZC3] = "CC3";
        itemNames[HTICK_CHUZC4] = "CC4";
        itemNames[HTICK_FTRAN] = "COL";
        itemNames[HTICK_BTRAN] = "REP";
        itemNames[HTICK_PRICE] = "RAP";
        itemNames[HTICK_FTRAN_DSE] = "DSE";
        itemNames[HTICK_FTRAN_MIX] = "MIX";
        itemNames[HTICK_UPDATE_DUAL] = "UPD";
        itemNames[HTICK_UPDATE_PRIMAL] = "UPP";
        itemNames[HTICK_UPDATE_WEIGHT] = "UPW";
        itemNames[HTICK_UPDATE_FACTOR] = "UPF";
        itemNames[HTICK_UPDATE_ROW_EP] = "UPR";

        reset();
    }